

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O3

void CppEphem::StrOpt::split
               (string *s,char *delim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *elems)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  string item;
  stringstream ss;
  value_type vStack_1c8;
  stringstream local_1a8 [392];
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)s,_Var2);
  std::__cxx11::string::string((string *)&vStack_1c8);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&vStack_1c8,*delim);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(elems,&vStack_1c8);
  }
  std::__cxx11::string::~string((string *)&vStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void CppEphem::StrOpt::split(const std::string&        s, 
                             const char&               delim, 
                             std::vector<std::string>* elems) 
{
    std::stringstream ss(s);
    std::string item=std::string();
    while (std::getline(ss, item, delim)) {
        elems->push_back(item);
    }
}